

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O3

void __thiscall
piksel::Shader::load(Shader *this,string *vertexShaderFilename,string *fragmentShaderFilename)

{
  string local_50;
  string local_30;
  
  readFile(&local_30,vertexShaderFilename);
  readFile(&local_50,fragmentShaderFilename);
  create(this,&local_30,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Shader::load(const std::string &vertexShaderFilename, const std::string &fragmentShaderFilename) {
    create(readFile(vertexShaderFilename), readFile(fragmentShaderFilename));
}